

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

optional<unsigned_int>
anon_unknown.dwarf_2e4c4a4::ParseKeyPathNum(Span<const_char> elem,bool *apostrophe,string *error)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  string_view str;
  uint32_t p;
  uint local_7c;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  long local_38;
  
  sVar7 = elem.m_size;
  pcVar5 = elem.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  if (sVar7 != 0) {
    cVar1 = pcVar5[sVar7 - 1];
    if ((cVar1 == 'h') || (uVar6 = 0, cVar1 == '\'')) {
      sVar7 = sVar7 - 1;
      *apostrophe = cVar1 == '\'';
      uVar6 = 0x80000000;
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar5,pcVar5 + sVar7);
  str._M_str = local_58._M_dataplus._M_p;
  str._M_len = local_58._M_string_length;
  bVar2 = ParseUInt32(str,&local_7c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    if (-1 < (int)local_7c) {
      uVar4 = (ulong)(local_7c | uVar6);
      uVar3 = 0x100000000;
      goto LAB_006ec9bc;
    }
    _GLOBAL__N_1::ParseKeyPathNum();
  }
  else {
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar5,pcVar5 + sVar7);
    tinyformat::format<std::__cxx11::string>
              (&local_58,(tinyformat *)"Key path value \'%s\' is not a valid uint32",
               (char *)local_78,error);
    _GLOBAL__N_1::ParseKeyPathNum();
  }
  uVar4 = 0;
  uVar3 = 0;
LAB_006ec9bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (optional<unsigned_int>)(uVar3 | uVar4);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint32_t> ParseKeyPathNum(Span<const char> elem, bool& apostrophe, std::string& error)
{
    bool hardened = false;
    if (elem.size() > 0) {
        const char last = elem[elem.size() - 1];
        if (last == '\'' || last == 'h') {
            elem = elem.first(elem.size() - 1);
            hardened = true;
            apostrophe = last == '\'';
        }
    }
    uint32_t p;
    if (!ParseUInt32(std::string(elem.begin(), elem.end()), &p)) {
        error = strprintf("Key path value '%s' is not a valid uint32", std::string(elem.begin(), elem.end()));
        return std::nullopt;
    } else if (p > 0x7FFFFFFFUL) {
        error = strprintf("Key path value %u is out of range", p);
        return std::nullopt;
    }

    return std::make_optional<uint32_t>(p | (((uint32_t)hardened) << 31));
}